

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int iVar1;
  row_iterator prVar2;
  longdouble *__return_storage_ptr__;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> prVar3;
  longdouble lVar4;
  bit_array *x_00;
  bool bVar5;
  int k_00;
  int r_size_00;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar6;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar7;
  type prVar8;
  type psVar9;
  pointer prVar10;
  pointer prVar11;
  type pbVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar13;
  longdouble lVar14;
  bool local_181;
  int local_bc;
  int selected;
  longdouble pi_change;
  int i;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 auStack_80 [4];
  int k;
  bool local_69;
  undefined1 auStack_68 [7];
  bool at_least_one_pi_changed;
  longdouble obj_amp_local;
  longdouble theta_local;
  longdouble delta_local;
  longdouble kappa_local;
  bit_array *x_local;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *this_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  stack0xffffffffffffffc8 = kappa;
  stack0xffffffffffffffb8 = delta;
  stack0xffffffffffffffa8 = theta;
  _auStack_68 = obj_amp;
  local_69 = false;
  lVar13 = in_ST3;
  lVar14 = in_ST3;
  unique0x10000548 = x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,
             "push-update-row {} {} {}\n");
  debug_logger<false>::log<long_double,long_double,long_double>
            ((debug_logger<false> *)this,_auStack_80,(longdouble *)((long)&delta_local + 8),
             (longdouble *)((long)&theta_local + 8),(longdouble *)((long)&obj_amp_local + 8));
  do {
    bVar5 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      return (bool)(local_69 & 1);
    }
    it.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (row_value *)last_local._M_current;
    k_00 = constraint<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                     (last_local);
    sparse_matrix<int>::row((sparse_matrix<int> *)&i,(int)this + 0x10);
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar2 = *pprVar6;
    pprVar7 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *)this,prVar2,*pprVar7,stack0xffffffffffffffa8);
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar2 = *pprVar6;
    pprVar7 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    r_size_00 = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                ::compute_reduced_costs<baryonyx::bit_array>
                          ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                            *)this,prVar2,*pprVar7,stack0xffffffffffffffd8);
    for (stack0xffffffffffffff58 = 0; lVar4 = _auStack_68, stack0xffffffffffffff58 != r_size_00;
        register0x00000000 = stack0xffffffffffffff58 + 1) {
      __return_storage_ptr__ = *(longdouble **)(this + 0x178);
      pprVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&i);
      prVar3 = *pprVar6;
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)stack0xffffffffffffff58);
      quadratic_cost_type<long_double>::operator()
                (__return_storage_ptr__,
                 (quadratic_cost_type<long_double> *)(ulong)(uint)prVar3[prVar8->id].column,
                 (int)stack0xffffffffffffffd8,(bit_array *)(long)prVar8->id);
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x60),(long)stack0xffffffffffffff58);
      prVar8->value = prVar8->value + lVar4 * in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar13;
      lVar13 = lVar14;
    }
    psVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::subsolver_type[]>_>
                           *)(this + 0x68),(long)k_00);
    switch(*psVar9) {
    case branch_and_bound:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_bc = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                 solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                           ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                            (this + 0x80),
                            (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x60),r_size_00,iVar1,pbVar12->max);
      break;
    case exhaustive:
      local_bc = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                 solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                           ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                            (this + 0x100),k_00,
                            (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x60),r_size_00);
      break;
    case unconstrained_branch_and_bound:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_bc = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                 ::select_variables((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                     *)this,r_size_00,iVar1,pbVar12->max);
      if (local_bc == -2) {
        pbVar12 = std::
                  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                                *)(this + 0x70),(long)k_00);
        iVar1 = pbVar12->min;
        pbVar12 = std::
                  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                                *)(this + 0x70),(long)k_00);
        local_bc = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                               *)(this + 0x60),r_size_00,iVar1,pbVar12->max);
      }
      break;
    case unconstrained_exhaustive:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_bc = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                 ::select_variables((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                     *)this,r_size_00,iVar1,pbVar12->max);
      if (local_bc == -2) {
        local_bc = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x100),k_00,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                               *)(this + 0x60),r_size_00);
      }
      break;
    case linear:
    default:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_bc = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                 ::select_variables_101
                           ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                             *)this,r_size_00,iVar1,pbVar12->max);
    }
    x_00 = stack0xffffffffffffffd8;
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    bVar5 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                      (this,x_00,*pprVar6,k_00,local_bc,r_size_00,stack0xffffffffffffffc8,
                       stack0xffffffffffffffb8);
    local_181 = (local_69 & 1U) != 0 || (longdouble)0 != (longdouble)bVar5;
    local_69 = local_181;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  } while( true );
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }